

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_data_source_seek_to_second(ma_data_source *pDataSource,float seekPointInSeconds)

{
  ma_result mVar1;
  ulong uVar2;
  ma_uint32 sampleRate;
  
  if (pDataSource != (ma_data_source *)0x0) {
    mVar1 = ma_data_source_get_data_format
                      (pDataSource,(ma_format *)0x0,(ma_uint32 *)0x0,&sampleRate,(ma_channel *)0x0,0
                      );
    if (mVar1 == MA_SUCCESS) {
      uVar2 = (ulong)((float)sampleRate * seekPointInSeconds);
      mVar1 = ma_data_source_seek_to_pcm_frame
                        (pDataSource,
                         (long)((float)sampleRate * seekPointInSeconds - 9.223372e+18) &
                         (long)uVar2 >> 0x3f | uVar2);
    }
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_data_source_seek_to_second(ma_data_source* pDataSource, float seekPointInSeconds)
{
    ma_uint64 frameIndex;
    ma_uint32 sampleRate;
    ma_result result;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need PCM frames instead of seconds */
    frameIndex = (ma_uint64)(seekPointInSeconds * sampleRate);

    return ma_data_source_seek_to_pcm_frame(pDataSource, frameIndex);
}